

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfe.cpp
# Opt level: O1

bool WriteHFE(FILE *f_,shared_ptr<Disk> *disk)

{
  element_type *peVar1;
  bool bVar2;
  undefined1 uVar3;
  uint8_t uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined8 *__s;
  Track *this;
  Sector *pSVar8;
  size_t sVar9;
  undefined4 extraout_var;
  BitBuffer *pBVar10;
  mapped_type *pmVar11;
  uint8_t *__ptr;
  exception *peVar12;
  undefined2 uVar13;
  Encoding EVar14;
  ulong uVar15;
  byte bVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  uint8_t *__s_00;
  uint uVar20;
  uint uVar21;
  byte bVar22;
  uint uVar23;
  CylHead cylhead;
  BitBuffer bitstream;
  map<CylHead,_BitBuffer,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_BitBuffer>_>_>
  bitstreams;
  TrackData trackdata;
  array<HFE_TRACK,_128UL> aTrackLUT;
  ulong local_468;
  CylHead local_440;
  BitBuffer local_438;
  _Rb_tree<CylHead,_std::pair<const_CylHead,_BitBuffer>,_std::_Select1st<std::pair<const_CylHead,_BitBuffer>_>,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_BitBuffer>_>_>
  local_3d0;
  TrackData local_3a0;
  TrackData local_2e8;
  CylHead local_230 [64];
  
  __s = (undefined8 *)operator_new(0x100);
  memset(__s,0xff,0x100);
  local_230[0].cyl = 0;
  local_230[0].head = 0;
  this = Disk::read_track((disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                          local_230,false);
  *__s = 0x4546434950435848;
  *(undefined1 *)(__s + 1) = 0;
  iVar5 = Disk::cyls((disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  *(char *)((long)__s + 9) = (char)iVar5;
  iVar5 = Disk::heads((disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  *(char *)((long)__s + 10) = (char)iVar5;
  EVar14 = opt.encoding;
  if (opt.encoding == Unknown) {
    bVar2 = Track::empty(this);
    EVar14 = Unknown;
    if (!bVar2) {
      pSVar8 = Track::operator[](this,0);
      EVar14 = pSVar8->encoding;
    }
  }
  uVar3 = 0xff;
  if (EVar14 - MFM < 8) {
    uVar3 = (undefined1)(0xffff01000200 >> ((char)EVar14 * '\b' - 8U & 0x3f));
  }
  *(undefined1 *)((long)__s + 0xb) = uVar3;
  uVar15 = (ulong)opt.datarate;
  if (opt.datarate == Unknown) {
    bVar2 = Track::empty(this);
    uVar15 = 0;
    if (!bVar2) {
      pSVar8 = Track::operator[](this,0);
      uVar15 = (ulong)pSVar8->datarate;
    }
  }
  uVar13 = 0xfa;
  if ((int)uVar15 != 0) {
    uVar13 = (short)(uVar15 / 1000);
  }
  *(undefined2 *)((long)__s + 0xc) = uVar13;
  *(undefined2 *)((long)__s + 0xe) = 0;
  bVar2 = Track::empty(this);
  bVar22 = 7;
  if (!bVar2) {
    pSVar8 = Track::operator[](this,0);
    if (pSVar8->encoding - MFM < 2) {
      pSVar8 = Track::operator[](this,0);
      bVar16 = 7;
      if (pSVar8->datarate == _500K) {
        bVar16 = 1;
      }
      bVar22 = 8;
      if (pSVar8->datarate != _1M) {
        bVar22 = bVar16;
      }
    }
    else if (pSVar8->encoding == Amiga) {
      pSVar8 = Track::operator[](this,0);
      bVar22 = 4;
      if (pSVar8->datarate != _250K) {
        bVar22 = (pSVar8->datarate != _500K) * '\x02' | 5;
      }
    }
  }
  *(byte *)(__s + 2) = bVar22;
  *(undefined1 *)((long)__s + 0x11) = 1;
  *(undefined2 *)((long)__s + 0x12) = 1;
  *(undefined4 *)((long)__s + 0x14) = 0xffffffff;
  *(undefined2 *)(__s + 3) = 0xffff;
  sVar9 = fwrite(__s,0x100,1,(FILE *)f_);
  if (sVar9 == 0) {
    peVar12 = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[12]>(peVar12,(char (*) [12])"write error");
  }
  else {
    iVar5 = fseek((FILE *)f_,(ulong)*(ushort *)((long)__s + 0x12) << 9,0);
    if (iVar5 == 0) {
      uVar15 = 0;
      memset(local_230,0,0x200);
      local_3d0._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_3d0._M_impl.super__Rb_tree_header._M_header;
      local_3d0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_3d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_3d0._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_3d0._M_impl.super__Rb_tree_header._M_header._M_right =
           local_3d0._M_impl.super__Rb_tree_header._M_header._M_left;
      if (*(char *)((long)__s + 9) == '\0') {
        iVar5 = 0x200;
      }
      else {
        iVar5 = 2;
        local_468 = 0;
        do {
          if (*(char *)((long)__s + 10) == '\0') {
            uVar17 = 0;
          }
          else {
            uVar20 = 0;
            uVar19 = 0;
            do {
              CylHead::CylHead(&local_440,(int)local_468,uVar20);
              peVar1 = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              iVar6 = (*peVar1->_vptr_Disk[4])(peVar1,&local_440,0);
              TrackData::TrackData(&local_3a0,(TrackData *)CONCAT44(extraout_var,iVar6));
              TrackData::preferred(&local_2e8,&local_3a0);
              pBVar10 = TrackData::bitstream(&local_2e8);
              local_438.datarate = pBVar10->datarate;
              local_438.encoding = pBVar10->encoding;
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                        (&local_438.m_data,&pBVar10->m_data);
              std::vector<int,_std::allocator<int>_>::vector
                        (&local_438.m_indexes,&pBVar10->m_indexes);
              std::vector<int,_std::allocator<int>_>::vector
                        (&local_438.m_sync_losses,&pBVar10->m_sync_losses);
              local_438.m_wrapped = pBVar10->m_wrapped;
              local_438.m_bitsize = pBVar10->m_bitsize;
              local_438.m_bitpos = pBVar10->m_bitpos;
              local_438.m_splicepos = pBVar10->m_splicepos;
              local_438.m_next_index = pBVar10->m_next_index;
              std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::~vector(&local_2e8.m_flux);
              if (local_2e8.m_bitstream.m_sync_losses.super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_2e8.m_bitstream.m_sync_losses.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_2e8.m_bitstream.m_sync_losses.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage -
                                (long)local_2e8.m_bitstream.m_sync_losses.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start);
              }
              if (local_2e8.m_bitstream.m_indexes.super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_2e8.m_bitstream.m_indexes.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_2e8.m_bitstream.m_indexes.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage -
                                (long)local_2e8.m_bitstream.m_indexes.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start);
              }
              if (local_2e8.m_bitstream.m_data.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_2e8.m_bitstream.m_data.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_2e8.m_bitstream.m_data.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_2e8.m_bitstream.m_data.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              std::vector<Sector,_std::allocator<Sector>_>::~vector(&local_2e8.m_track.m_sectors);
              iVar7 = BitBuffer::track_bitsize(&local_438);
              iVar6 = iVar7 + 0xe;
              if (-1 < iVar7 + 7) {
                iVar6 = iVar7 + 7;
              }
              uVar17 = (ulong)(uint)(iVar6 >> 3);
              if (iVar6 >> 3 <= (int)uVar19) {
                uVar17 = uVar19;
              }
              if ((int)uVar15 <= (int)uVar17) {
                uVar15 = uVar17;
              }
              pmVar11 = std::
                        map<CylHead,_BitBuffer,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_BitBuffer>_>_>
                        ::operator[]((map<CylHead,_BitBuffer,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_BitBuffer>_>_>
                                      *)&local_3d0,&local_440);
              pmVar11->datarate = local_438.datarate;
              pmVar11->encoding = local_438.encoding;
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                        (&pmVar11->m_data,&local_438.m_data);
              std::vector<int,_std::allocator<int>_>::_M_move_assign
                        (&pmVar11->m_indexes,&local_438.m_indexes);
              std::vector<int,_std::allocator<int>_>::_M_move_assign
                        (&pmVar11->m_sync_losses,&local_438.m_sync_losses);
              pmVar11->m_wrapped = local_438.m_wrapped;
              pmVar11->m_bitsize = local_438.m_bitsize;
              pmVar11->m_bitpos = local_438.m_bitpos;
              pmVar11->m_splicepos = local_438.m_splicepos;
              pmVar11->m_next_index = local_438.m_next_index;
              if (local_438.m_sync_losses.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_438.m_sync_losses.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_438.m_sync_losses.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage -
                                (long)local_438.m_sync_losses.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start);
              }
              if (local_438.m_indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_438.m_indexes.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_438.m_indexes.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage -
                                (long)local_438.m_indexes.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start);
              }
              if (local_438.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_438.m_data.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_438.m_data.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_438.m_data.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::~vector(&local_3a0.m_flux);
              if (local_3a0.m_bitstream.m_sync_losses.super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_3a0.m_bitstream.m_sync_losses.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_3a0.m_bitstream.m_sync_losses.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage -
                                (long)local_3a0.m_bitstream.m_sync_losses.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start);
              }
              if (local_3a0.m_bitstream.m_indexes.super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_3a0.m_bitstream.m_indexes.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_3a0.m_bitstream.m_indexes.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage -
                                (long)local_3a0.m_bitstream.m_indexes.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start);
              }
              if (local_3a0.m_bitstream.m_data.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_3a0.m_bitstream.m_data.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_3a0.m_bitstream.m_data.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_3a0.m_bitstream.m_data.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              std::vector<Sector,_std::allocator<Sector>_>::~vector(&local_3a0.m_track.m_sectors);
              uVar20 = uVar20 + 1;
              uVar19 = uVar17;
            } while (uVar20 < *(byte *)((long)__s + 10));
          }
          *(short *)(&local_230[0].cyl + local_468) = (short)iVar5;
          *(short *)((long)&local_230[0].cyl + local_468 * 4 + 2) = (short)uVar17 * 2;
          iVar5 = iVar5 + (int)(uVar17 >> 8) + 1;
          local_468 = local_468 + 1;
        } while (local_468 < *(byte *)((long)__s + 9));
        iVar5 = (int)uVar15 * 2 + 0x200;
      }
      sVar9 = fwrite(local_230,4,0x80,(FILE *)f_);
      if (sVar9 != 0x80) {
        peVar12 = (exception *)__cxa_allocate_exception(0x10);
        util::exception::exception<char_const(&)[12]>(peVar12,(char (*) [12])"write error");
        __cxa_throw(peVar12,&util::exception::typeinfo,std::runtime_error::~runtime_error);
      }
      __ptr = AllocMem(iVar5);
      if (*(char *)((long)__s + 9) != '\0') {
        uVar15 = 0;
        do {
          if (*(char *)((long)__s + 10) != '\0') {
            lVar18 = 0;
            do {
              CylHead::CylHead(&local_3a0.cylhead,(int)uVar15,(int)lVar18);
              pmVar11 = std::
                        map<CylHead,_BitBuffer,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_BitBuffer>_>_>
                        ::operator[]((map<CylHead,_BitBuffer,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_BitBuffer>_>_>
                                      *)&local_3d0,&local_3a0.cylhead);
              iVar5 = BitBuffer::track_bitsize(pmVar11);
              BitBuffer::seek(pmVar11,0);
              if (0 < iVar5) {
                __s_00 = __ptr + lVar18 * 0x100;
                uVar20 = iVar5 + 7U >> 3;
                do {
                  uVar23 = 0x100;
                  if ((int)uVar20 < 0x100) {
                    uVar23 = uVar20;
                  }
                  uVar21 = uVar23;
                  if (0 < (int)uVar20) {
                    do {
                      uVar4 = BitBuffer::read8_lsb(pmVar11);
                      *__s_00 = uVar4;
                      __s_00 = __s_00 + 1;
                      uVar21 = uVar21 - 1;
                    } while (uVar21 != 0);
                  }
                  memset(__s_00,0x55,(ulong)(0x100 - uVar23));
                  __s_00 = __s_00 + (0x200 - uVar23);
                  uVar21 = uVar20 - uVar23;
                  bVar2 = (int)uVar23 <= (int)uVar20;
                  uVar20 = uVar21;
                } while (uVar21 != 0 && bVar2);
              }
              lVar18 = lVar18 + 1;
            } while ((uint)lVar18 < (uint)*(byte *)((long)__s + 10));
          }
          fseek((FILE *)f_,(ulong)(ushort)(&local_230[0].cyl)[uVar15] << 9,0);
          uVar17 = (ulong)(*(ushort *)((long)&local_230[0].cyl + uVar15 * 4 + 2) + 0x1ff & 0x1fe00);
          sVar9 = fwrite(__ptr,1,uVar17,(FILE *)f_);
          if (sVar9 != uVar17) {
            peVar12 = (exception *)__cxa_allocate_exception(0x10);
            util::exception::exception<char_const(&)[12]>(peVar12,(char (*) [12])"write error");
            __cxa_throw(peVar12,&util::exception::typeinfo,std::runtime_error::~runtime_error);
          }
          bVar22 = (char)uVar15 + 1;
          uVar15 = (ulong)bVar22;
        } while (bVar22 < *(byte *)((long)__s + 9));
      }
      FreeMem(__ptr);
      std::
      _Rb_tree<CylHead,_std::pair<const_CylHead,_BitBuffer>,_std::_Select1st<std::pair<const_CylHead,_BitBuffer>_>,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_BitBuffer>_>_>
      ::~_Rb_tree(&local_3d0);
      operator_delete(__s,0x100);
      return true;
    }
    peVar12 = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[11]>(peVar12,(char (*) [11])"seek error");
  }
  __cxa_throw(peVar12,&util::exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool WriteHFE(FILE* f_, std::shared_ptr<Disk>& disk)
{
    std::vector<uint8_t> header(256, 0xff);
    auto& hh = *reinterpret_cast<HFE_HEADER*>(header.data());

    auto& track0 = disk->read_track({ 0, 0 });

    strncpy(hh.header_signature, HFE_SIGNATURE, sizeof(hh.header_signature));
    hh.format_revision = 0x00;
    hh.number_of_tracks = static_cast<uint8_t>(disk->cyls());
    hh.number_of_sides = static_cast<uint8_t>(disk->heads());
    hh.track_encoding = HfeTrackEncoding(track0);
    hh.bitrate_kbps = util::htole(HfeDataRate(track0));
    hh.floppy_rpm = 0;
    hh.floppy_interface_mode = HfeInterfaceMode(track0);
    hh.do_not_use = 0x01;
    hh.track_list_offset = util::htole(static_cast<uint16_t>(0x200 >> 9));
    hh.write_allowed = 0xff;
    hh.single_step = 0xff;
    hh.track0s0_altencoding = 0xff;
    hh.track0s0_encoding = 0xff;
    hh.track0s1_altencoding = 0xff;
    hh.track0s1_encoding = 0xff;

    if (!fwrite(header.data(), header.size(), 1, f_))
        throw util::exception("write error");
    if (fseek(f_, hh.track_list_offset << 9, SEEK_SET))
        throw util::exception("seek error");

    std::array<HFE_TRACK, MAX_TRACKS> aTrackLUT{};
    std::map<CylHead, BitBuffer> bitstreams;
    int data_offset = 2;

    auto max_disk_track_bytes = 0;
    for (uint8_t cyl = 0; cyl < hh.number_of_tracks; ++cyl)
    {
        auto max_track_bytes = 0;
        for (uint8_t head = 0; head < hh.number_of_sides; ++head)
        {
            CylHead cylhead(cyl, head);
            auto trackdata = disk->read(cylhead);
            auto bitstream = trackdata.preferred().bitstream();
            auto track_bytes = (bitstream.track_bitsize() + 7) / 8;
            max_track_bytes = std::max(track_bytes, max_track_bytes);
            max_disk_track_bytes = std::max(max_disk_track_bytes, max_track_bytes);
            bitstreams[cylhead] = std::move(bitstream);
        }

        aTrackLUT[cyl].offset = util::htole(static_cast<uint16_t>(data_offset));
        aTrackLUT[cyl].track_len = util::htole(static_cast<uint16_t>(max_track_bytes * 2));

        data_offset += ((max_track_bytes * 2) / 512) + 1;
    }

    if (fwrite(aTrackLUT.data(), sizeof(aTrackLUT[0]), aTrackLUT.size(), f_) != aTrackLUT.size())
        throw util::exception("write error");

    MEMORY mem(max_disk_track_bytes * 2 + 512);
    for (uint8_t cyl = 0; cyl < hh.number_of_tracks; ++cyl)
    {
        uint8_t* pbTrack{};
        for (uint8_t head = 0; head < hh.number_of_sides; ++head)
        {
            auto& bitstream = bitstreams[{ cyl, head }];
            auto track_bytes = (bitstream.track_bitsize() + 7) / 8;
            bitstream.seek(0);

            pbTrack = mem.pb + head * 256;
            while (track_bytes > 0)
            {
                auto chunk_size = std::min(track_bytes, 0x100);
                for (int i = 0; i < chunk_size; ++i)
                    *pbTrack++ = bitstream.read8_lsb();
                memset(pbTrack, 0x55, 0x100 - chunk_size);
                pbTrack += 0x200 - chunk_size;
                track_bytes -= chunk_size;
            }
        }

        fseek(f_, util::letoh(aTrackLUT[cyl].offset) * 512, SEEK_SET);
        auto track_len = (util::letoh(aTrackLUT[cyl].track_len) + 511) & ~0x1ff;
        if (fwrite(mem.pb, 1, track_len, f_) != static_cast<size_t>(track_len))
            throw util::exception("write error");
    }

    return true;
}